

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Status json_validate(JSON_Value *schema,JSON_Value *value)

{
  int iVar1;
  JSON_Status JVar2;
  unsigned_long *puVar3;
  JSON_Value *pJVar4;
  JSON_Value *pJVar5;
  JSON_Object *pJVar6;
  ulong uVar7;
  size_t sVar8;
  JSON_Object *pJVar9;
  unsigned_long *puVar10;
  char *name;
  
  if ((value != (JSON_Value *)0x0 && schema != (JSON_Value *)0x0) &&
     ((iVar1 = schema->type, iVar1 == 1 || (iVar1 == value->type)))) {
    switch(iVar1) {
    case 1:
    case 2:
    case 3:
    case 6:
      return 0;
    case 4:
      if (schema->type == 4) {
        pJVar6 = (schema->value).object;
      }
      else {
        pJVar6 = (JSON_Object *)0x0;
      }
      if (value->type == 4) {
        pJVar9 = (value->value).object;
      }
      else {
        pJVar9 = (JSON_Object *)0x0;
      }
      if (pJVar6 == (JSON_Object *)0x0) {
        sVar8 = 0;
      }
      else {
        sVar8 = pJVar6->count;
      }
      if (sVar8 == 0) {
        return 0;
      }
      if (pJVar9 == (JSON_Object *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = pJVar9->count;
      }
      if (sVar8 <= uVar7) {
        uVar7 = 0;
        while( true ) {
          if ((pJVar6 == (JSON_Object *)0x0) || (pJVar6->count <= uVar7)) {
            name = (char *)0x0;
          }
          else {
            name = pJVar6->names[uVar7];
          }
          pJVar4 = json_object_get_value(pJVar6,name);
          pJVar5 = json_object_get_value(pJVar9,name);
          if ((pJVar5 == (JSON_Value *)0x0) || (JVar2 = json_validate(pJVar4,pJVar5), JVar2 != 0))
          break;
          uVar7 = uVar7 + 1;
          if (sVar8 + (sVar8 == 0) == uVar7) {
            return 0;
          }
        }
      }
      break;
    case 5:
      if (schema->type == 5) {
        pJVar6 = (schema->value).object;
      }
      else {
        pJVar6 = (JSON_Object *)0x0;
      }
      if (value->type == 5) {
        pJVar9 = (value->value).object;
      }
      else {
        pJVar9 = (JSON_Object *)0x0;
      }
      if (pJVar6 == (JSON_Object *)0x0) {
        return 0;
      }
      if (pJVar6->hashes == (unsigned_long *)0x0) {
        return 0;
      }
      if ((pJVar6 == (JSON_Object *)0x0) || (pJVar6->hashes == (unsigned_long *)0x0)) {
        pJVar4 = (JSON_Value *)0x0;
      }
      else {
        pJVar4 = (JSON_Value *)*pJVar6->cells;
      }
      puVar10 = (unsigned_long *)0x0;
      do {
        if (pJVar9 == (JSON_Object *)0x0) {
          puVar3 = (unsigned_long *)0x0;
        }
        else {
          puVar3 = pJVar9->hashes;
        }
        if (puVar3 <= puVar10) {
          return 0;
        }
        if ((pJVar9 == (JSON_Object *)0x0) || (pJVar9->hashes <= puVar10)) {
          pJVar5 = (JSON_Value *)0x0;
        }
        else {
          pJVar5 = (JSON_Value *)pJVar9->cells[(long)puVar10];
        }
        JVar2 = json_validate(pJVar4,pJVar5);
        puVar10 = (unsigned_long *)((long)puVar10 + 1);
      } while (JVar2 == 0);
    }
  }
  return -1;
}

Assistant:

JSON_Status json_validate(const JSON_Value *schema, const JSON_Value *value) {
    JSON_Value *temp_schema_value = NULL, *temp_value = NULL;
    JSON_Array *schema_array = NULL, *value_array = NULL;
    JSON_Object *schema_object = NULL, *value_object = NULL;
    JSON_Value_Type schema_type = JSONError, value_type = JSONError;
    const char *key = NULL;
    size_t i = 0, count = 0;
    if (schema == NULL || value == NULL) {
        return JSONFailure;
    }
    schema_type = json_value_get_type(schema);
    value_type = json_value_get_type(value);
    if (schema_type != value_type && schema_type != JSONNull) { /* null represents all values */
        return JSONFailure;
    }
    switch (schema_type) {
        case JSONArray:
            schema_array = json_value_get_array(schema);
            value_array = json_value_get_array(value);
            count = json_array_get_count(schema_array);
            if (count == 0) {
                return JSONSuccess; /* Empty array allows all types */
            }
            /* Get first value from array, rest is ignored */
            temp_schema_value = json_array_get_value(schema_array, 0);
            for (i = 0; i < json_array_get_count(value_array); i++) {
                temp_value = json_array_get_value(value_array, i);
                if (json_validate(temp_schema_value, temp_value) != JSONSuccess) {
                    return JSONFailure;
                }
            }
            return JSONSuccess;
        case JSONObject:
            schema_object = json_value_get_object(schema);
            value_object = json_value_get_object(value);
            count = json_object_get_count(schema_object);
            if (count == 0) {
                return JSONSuccess; /* Empty object allows all objects */
            } else if (json_object_get_count(value_object) < count) {
                return JSONFailure; /* Tested object mustn't have less name-value pairs than schema */
            }
            for (i = 0; i < count; i++) {
                key = json_object_get_name(schema_object, i);
                temp_schema_value = json_object_get_value(schema_object, key);
                temp_value = json_object_get_value(value_object, key);
                if (temp_value == NULL) {
                    return JSONFailure;
                }
                if (json_validate(temp_schema_value, temp_value) != JSONSuccess) {
                    return JSONFailure;
                }
            }
            return JSONSuccess;
        case JSONString: case JSONNumber: case JSONBoolean: case JSONNull:
            return JSONSuccess; /* equality already tested before switch */
        case JSONError: default:
            return JSONFailure;
    }
}